

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<int,_std::less<void>_>::k_ary_search_set
          (k_ary_search_set<int,_std::less<void>_> *this,initializer_list<int> values,size_t arity,
          value_compare *compare)

{
  iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag> local_40;
  value_compare *local_30;
  value_compare *compare_local;
  size_t arity_local;
  k_ary_search_set<int,_std::less<void>_> *this_local;
  initializer_list<int> values_local;
  
  values_local._M_array = (iterator)values._M_len;
  this_local = (k_ary_search_set<int,_std::less<void>_> *)values._M_array;
  local_30 = compare;
  compare_local = (value_compare *)arity;
  arity_local = (size_t)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->m_values);
  this->m_arity = (size_t)compare_local;
  local_40.super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> =
       (iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>)
       boost::make_iterator_range<std::initializer_list<int>>((initializer_list<int> *)&this_local);
  k_ary_search_set<int,std::less<void>>::initialize<boost::iterator_range<int_const*>>
            ((k_ary_search_set<int,std::less<void>> *)this,(iterator_range<const_int_*> *)&local_40)
  ;
  return;
}

Assistant:

explicit k_ary_search_set
                (
                    std::initializer_list<value_type> values,
                    std::size_t arity = default_arity,
                    const value_compare & compare = value_compare()
                ):
            m_arity(arity),
            m_compare(compare)
        {
            initialize(boost::make_iterator_range(values));
        }